

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::
FastGeneralizationsIterator::findNextLeaf(FastGeneralizationsIterator *this)

{
  uint *puVar1;
  long *plVar2;
  int *piVar3;
  void ***pppvVar4;
  ArrayMapEntry<Kernel::TermList> *pAVar5;
  void **ppvVar6;
  bool bVar7;
  bool separate;
  int iVar8;
  Node *pNVar9;
  Node *pNVar10;
  uint *puVar11;
  uint uVar12;
  void **ppvVar13;
  void **ppvVar14;
  uint *puVar15;
  NodeAlgorithm *pNVar16;
  long *plVar17;
  Node *curr;
  Node *local_40;
  VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
      puVar11 = (this->_subst)._boundVars._cursor;
      uVar12 = puVar11[-1];
      puVar11 = puVar11 + -1;
      if (uVar12 != 0xffffffff) {
        pAVar5 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array
        ;
        do {
          pAVar5[uVar12]._timestamp = 0;
          uVar12 = puVar11[-1];
          puVar11 = puVar11 + -1;
        } while (uVar12 != 0xffffffff);
      }
      (this->_subst)._boundVars._cursor = puVar11;
      this->_inLeaf = false;
      local_40 = (Node *)0x0;
      separate = false;
LAB_00366915:
LAB_00366925:
      do {
        uVar12 = 0;
        pNVar9 = local_40;
        if (local_40 != (Node *)0x0) {
          puVar11 = (this->_specVarNumbers)._cursor + -1;
          if (separate == false) {
            (this->_specVarNumbers)._cursor = puVar11;
          }
          uVar12 = *puVar11;
        }
        do {
          pNVar10 = pNVar9;
          if (pNVar10 != (Node *)0x0) break;
          pAVar5 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>.
                   _array;
          ppvVar6 = (this->_alternatives)._stack;
          puVar11 = (this->_subst)._boundVars._cursor;
          puVar15 = (this->_specVarNumbers)._cursor;
          pNVar16 = (this->_nodeTypes)._cursor;
          ppvVar13 = (this->_alternatives)._cursor;
          while( true ) {
            ppvVar14 = ppvVar13 + -1;
            if (ppvVar13 == ppvVar6) {
              return false;
            }
            (this->_alternatives)._cursor = ppvVar14;
            plVar17 = (long *)*ppvVar14;
            if (plVar17 != (long *)0x0) break;
            pNVar16 = pNVar16 + -1;
            (this->_nodeTypes)._cursor = pNVar16;
            puVar15 = puVar15 + -1;
            (this->_specVarNumbers)._cursor = puVar15;
            ppvVar13 = ppvVar14;
            if (ppvVar14 != ppvVar6) {
              while( true ) {
                puVar1 = puVar11 + -1;
                puVar11 = puVar11 + -1;
                if (*puVar1 == 0xffffffff) break;
                pAVar5[*puVar1]._timestamp = 0;
              }
              (this->_subst)._boundVars._cursor = puVar11;
            }
          }
          pNVar16 = (this->_nodeTypes)._cursor;
          pNVar9 = (Node *)*plVar17;
          if (pNVar16[-1] == UNSORTED_LIST) {
            while (pNVar9 != (Node *)0x0) {
              if (((pNVar9->_term)._content & 1) != 0) goto LAB_00366a46;
              plVar2 = plVar17 + 1;
              plVar17 = plVar17 + 1;
              pNVar9 = (Node *)*plVar2;
            }
            pNVar9 = (Node *)0x0;
LAB_00366a46:
            do {
              plVar2 = plVar17 + 1;
              local_40 = pNVar9;
              if (*plVar2 == 0) {
                separate = false;
                pNVar10 = pNVar9;
                goto LAB_00366a93;
              }
              plVar17 = plVar17 + 1;
            } while ((*(byte *)(*plVar2 + 8) & 1) == 0);
LAB_00366a59:
            if (ppvVar14 == (this->_alternatives)._end) {
              Lib::Stack<void_*>::expand(&this->_alternatives);
              ppvVar14 = (this->_alternatives)._cursor;
            }
            *ppvVar14 = plVar17;
            pppvVar4 = &(this->_alternatives)._cursor;
            *pppvVar4 = *pppvVar4 + 1;
            separate = true;
LAB_00366a7f:
            puVar11 = (this->_specVarNumbers)._cursor + -1;
            pNVar10 = local_40;
          }
          else {
            if (((pNVar9->_term)._content & 1) == 0) {
              if (separate != false) goto LAB_00366a7f;
            }
            else {
              plVar17 = (long *)plVar17[1];
              local_40 = pNVar9;
              if ((plVar17 != (long *)0x0) && ((*(byte *)(*plVar17 + 8) & 1) != 0))
              goto LAB_00366a59;
              separate = false;
              pNVar10 = pNVar9;
            }
LAB_00366a93:
            (this->_nodeTypes)._cursor = pNVar16 + -1;
            puVar11 = (this->_specVarNumbers)._cursor + -1;
            (this->_specVarNumbers)._cursor = puVar11;
          }
          uVar12 = *puVar11;
          pNVar9 = (Node *)0x0;
        } while (pNVar10 == (Node *)0x0);
        bVar7 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::GenMatcher::
                matchNext(&this->_subst,uVar12,(TermList)(pNVar10->_term)._content,separate);
        if (bVar7) {
          do {
            do {
              iVar8 = (*local_40->_vptr_Node[2])();
              if ((((char)iVar8 != '\0') || (iVar8 = (*local_40->_vptr_Node[5])(), iVar8 != 1)) ||
                 (*(int *)((long)&local_40[1]._vptr_Node + 4) != 1)) {
                iVar8 = (*local_40->_vptr_Node[2])();
                if ((char)iVar8 != '\0') {
                  (*local_40->_vptr_Node[8])(&local_38);
                  Lib::VirtualIterator<Inferences::ALASCA::BinaryResolutionConf::Rhs_*>::operator=
                            (&this->_ldIterator,&local_38);
                  if (local_38._core !=
                      (IteratorCore<Inferences::ALASCA::BinaryResolutionConf::Rhs_*> *)0x0) {
                    piVar3 = &(local_38._core)->_refCnt;
                    *piVar3 = *piVar3 + -1;
                    if (*piVar3 == 0) {
                      (*(local_38._core)->_vptr_IteratorCore[1])();
                    }
                  }
                  this->_inLeaf = true;
                  return true;
                }
                separate = enterNode(this,&local_40);
                if ((local_40 == (Node *)0x0) &&
                   ((this->_alternatives)._cursor != (this->_alternatives)._stack)) {
                  puVar11 = (this->_subst)._boundVars._cursor;
                  uVar12 = puVar11[-1];
                  puVar11 = puVar11 + -1;
                  if (uVar12 != 0xffffffff) {
                    pAVar5 = (this->_subst)._bindings.
                             super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
                    do {
                      pAVar5[uVar12]._timestamp = 0;
                      uVar12 = puVar11[-1];
                      puVar11 = puVar11 + -1;
                    } while (uVar12 != 0xffffffff);
                  }
                  goto LAB_00366c66;
                }
                goto LAB_00366925;
              }
              pNVar9 = local_40 + 1;
              local_40 = (Node *)local_40[1]._term._content;
              bVar7 = SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::GenMatcher::
                      matchNextAux(&this->_subst,
                                   (TermList)
                                   (this->_subst)._specVars._array[*(uint *)&pNVar9->_vptr_Node].
                                   _content,(TermList)(local_40->_term)._content,false);
            } while (bVar7);
            if ((separate != false) ||
               ((this->_alternatives)._cursor != (this->_alternatives)._stack)) {
              puVar11 = (this->_subst)._boundVars._cursor;
              uVar12 = puVar11[-1];
              puVar11 = puVar11 + -1;
              if (uVar12 != 0xffffffff) {
                pAVar5 = (this->_subst)._bindings.
                         super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
                do {
                  pAVar5[uVar12]._timestamp = 0;
                  uVar12 = puVar11[-1];
                  puVar11 = puVar11 + -1;
                } while (uVar12 != 0xffffffff);
              }
              (this->_subst)._boundVars._cursor = puVar11;
            }
            local_40 = (Node *)0x0;
          } while (bVar7);
          goto LAB_00366925;
        }
        local_40 = (Node *)0x0;
        if ((separate == false) && ((this->_alternatives)._cursor != (this->_alternatives)._stack))
        {
          puVar11 = (this->_subst)._boundVars._cursor;
          uVar12 = puVar11[-1];
          puVar11 = puVar11 + -1;
          if (uVar12 != 0xffffffff) {
            pAVar5 = (this->_subst)._bindings.super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>.
                     _array;
            do {
              pAVar5[uVar12]._timestamp = 0;
              uVar12 = puVar11[-1];
              puVar11 = puVar11 + -1;
            } while (uVar12 != 0xffffffff);
          }
LAB_00366c66:
          (this->_subst)._boundVars._cursor = puVar11;
        }
      } while( true );
    }
  }
  else {
    local_40 = this->_root;
    if (local_40 != (Node *)0x0) {
      this->_root = (Node *)0x0;
      separate = enterNode(this,&local_40);
      goto LAB_00366915;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
	ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
	currSpecVar=_specVarNumbers.top();
      } else {
	currSpecVar=_specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
	//there's no alternative at this level, we have to backtrack
	_nodeTypes.pop();
	_specVarNumbers.pop();
	if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType=_nodeTypes.top();

      //proper term nodes that we want to enter don't appear
      //on _alternatives stack (as we always enter them first)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	curr=*(alts++);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	if(alts->head()->term().isVar()) {
	  curr=alts->head();
	  if(alts->tail() && alts->tail()->head()->term().isVar()) {
	    _alternatives.push(alts->tail());
	    sibilingsRemain=true;
	  } else {
	    sibilingsRemain=false;
	  }
	}
      }

      if(sibilingsRemain) {
	currSpecVar=_specVarNumbers.top();
      } else {
	_nodeTypes.pop();
	currSpecVar=_specVarNumbers.pop();
      }
      if(curr) {
	break;
      }
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
        _subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst->backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}